

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<kj::StringPtr_&> __thiscall
kj::Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
find<0ul,kj::String&>
          (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *this,
          String *params)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  uint hash;
  uint uVar5;
  int iVar6;
  char *__s2;
  uint *puVar7;
  long lVar8;
  uchar *puVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ArrayPtr<const_unsigned_char> s;
  
  if (*(long *)(this + 0x38) != 0) {
    sVar1 = (params->content).size_;
    if (sVar1 == 0) {
      puVar9 = "";
    }
    else {
      puVar9 = (uchar *)(params->content).ptr;
    }
    lVar2 = *(long *)this;
    s.size_ = (sVar1 - 1) + (ulong)(sVar1 == 0);
    s.ptr = puVar9;
    hash = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s);
    uVar5 = _::chooseBucket(hash,*(uint *)(this + 0x38));
    lVar3 = *(long *)(this + 0x30);
    uVar12 = (ulong)uVar5;
    uVar5 = *(uint *)(lVar3 + 4 + uVar12 * 8);
    if (uVar5 != 0) {
      sVar1 = (params->content).size_;
      lVar8 = sVar1 + (sVar1 == 0);
      if (sVar1 == 0) {
        __s2 = "";
      }
      else {
        __s2 = (params->content).ptr;
      }
      puVar7 = (uint *)(lVar3 + uVar12 * 8);
      uVar4 = *(ulong *)(this + 0x38);
      do {
        if ((((uVar5 != 1) && (*puVar7 == hash)) &&
            (lVar10 = (ulong)(uVar5 - 2) * 0x10, *(long *)(lVar2 + 8 + lVar10) == lVar8)) &&
           (iVar6 = bcmp(*(void **)(lVar2 + lVar10),__s2,lVar8 - 1), iVar6 == 0)) {
          return (Maybe<kj::StringPtr_&>)(StringPtr *)(lVar10 + *(long *)this);
        }
        uVar11 = uVar12 + 1;
        uVar12 = uVar11 & 0xffffffff;
        if (uVar11 == uVar4) {
          uVar12 = 0;
        }
        puVar7 = (uint *)(lVar3 + uVar12 * 8);
        uVar5 = puVar7[1];
      } while (uVar5 != 0);
    }
  }
  return (Maybe<kj::StringPtr_&>)(StringPtr *)0x0;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }